

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

string * __thiscall
BayesianGameBase::SoftPrintType_abi_cxx11_(BayesianGameBase *this,Index agentI,Index typeIndex)

{
  ostream *this_00;
  uint in_ECX;
  string *in_RDI;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  uint local_18;
  
  local_18 = in_ECX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = std::operator<<(local_190,"BGType");
  std::ostream::operator<<(this_00,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string BayesianGameBase::SoftPrintType(Index agentI, Index typeIndex) const
{
    stringstream ss;
    ss << "BGType"<<typeIndex;
    return(ss.str());
}